

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# was_added.c
# Opt level: O2

int was_added(pair_t **l,uint32 src)

{
  int iVar1;
  pair_t *ppVar2;
  
  iVar1 = find_added(*l,src);
  if (iVar1 == 0) {
    ppVar2 = (pair_t *)
             __ckd_calloc__(1,0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/was_added.c"
                            ,0xa7);
    ppVar2->src_id = src;
    ppVar2->next = *l;
    *l = ppVar2;
  }
  return iVar1;
}

Assistant:

int
was_added(pair_t **l,
	  uint32 src)
{
    pair_t *new;
    int ret;

    /* see if given src has been added to the destination yet or not */
    ret = find_added(*l, src);

    if (ret == FALSE) {
	/* it hasn't, so prepend an entry for it on the list */

	new = (pair_t *)ckd_calloc(1, sizeof(pair_t));

	new->src_id = src;
    
	new->next = *l;
	*l = new;
    }

    return ret;
}